

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_convolution_add(NetOptimize *this)

{
  int iVar1;
  uint _w;
  uint uVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  Layer *pLVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong local_88;
  Mat bias_data;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar15 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_88 = 1;
  uVar13 = 0;
  while( true ) {
    if (uVar13 == uVar15) {
      return 0;
    }
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar13]->type,"Convolution");
    if (!bVar10) break;
LAB_00143575:
    uVar13 = uVar13 + 1;
    local_88 = local_88 + 1;
  }
  iVar1 = *((((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar13]->tops).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  uVar14 = local_88;
LAB_00143599:
  if (uVar14 < uVar15) {
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"BinaryOp");
    if (((bVar10) ||
        (pLVar4 = (((this->super_ModelWriter).layers)->
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar14],
        piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (long)*(pointer *)
               ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
        - (long)piVar5 != 8)) || (*piVar5 != iVar1)) goto LAB_001435da;
    if (uVar15 != uVar14) {
      ppLVar6 = (((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pLVar4 = ppLVar6[uVar14];
      if ((*(int *)&pLVar4[1]._vptr_Layer == 0) && (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)
         ) {
        pLVar7 = ppLVar6[uVar13];
        uVar12 = uVar14;
        if (uVar15 < uVar14) {
          uVar12 = uVar15;
        }
        uVar16 = 0;
        while ((uVar11 = uVar12, uVar12 != uVar16 &&
               ((bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                                          "MemoryData"), bVar10 ||
                (uVar11 = uVar16,
                *((((this->super_ModelWriter).layers)->
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16]->tops).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start !=
                *(int *)(*(long *)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 4)))))) {
          uVar16 = uVar16 + 1;
        }
        if (uVar11 != uVar14) {
          pLVar8 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          _w = *(uint *)&pLVar7[1]._vptr_Layer;
          uVar14 = (ulong)_w;
          if ((*(uint *)&pLVar8[1]._vptr_Layer == _w) &&
             (*(int *)((long)&pLVar8[1]._vptr_Layer + 4) == 0)) {
            iVar1._0_1_ = pLVar8[1].one_blob_only;
            iVar1._1_1_ = pLVar8[1].support_inplace;
            iVar1._2_1_ = pLVar8[1].support_vulkan;
            iVar1._3_1_ = pLVar8[1].support_packing;
            bVar10 = iVar1 == 0;
          }
          else {
            bVar10 = false;
          }
          if ((*(uint *)&pLVar8[1]._vptr_Layer == 1) &&
             (*(int *)((long)&pLVar8[1]._vptr_Layer + 4) == 1)) {
            uVar2._0_1_ = pLVar8[1].one_blob_only;
            uVar2._1_1_ = pLVar8[1].support_inplace;
            uVar2._2_1_ = pLVar8[1].support_vulkan;
            uVar2._3_1_ = pLVar8[1].support_packing;
            if (uVar2 == _w || bVar10) {
LAB_001436e8:
              fprintf(_stderr,"fuse_convolution_add %s %s\n",(pLVar7->name)._M_dataplus._M_p);
              ncnn::Mat::reshape(&bias_data,(Mat *)&pLVar8[1].support_tensor_storage,_w,
                                 (Allocator *)0x0);
              if (*(int *)&pLVar7[1].type._M_dataplus._M_p == 0) {
                *(undefined4 *)&pLVar7[1].type._M_dataplus._M_p = 1;
                ncnn::Mat::operator=((Mat *)&pLVar7[2].one_blob_only,&bias_data);
              }
              else {
                lVar9 = *(long *)&pLVar7[2].one_blob_only;
                if ((int)_w < 1) {
                  uVar14 = 0;
                }
                for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
                  *(float *)(lVar9 + uVar12 * 4) =
                       *(float *)(lVar9 + uVar12 * 4) +
                       *(float *)((long)bias_data.data + uVar12 * 4);
                }
              }
              iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = iVar1;
              (((this->super_ModelWriter).blobs)->
              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar1].producer = (int)uVar13;
              std::__cxx11::string::assign((char *)&pLVar4->type);
              ncnn::Mat::~Mat(&bias_data);
            }
          }
          else if (bVar10) goto LAB_001436e8;
        }
      }
    }
  }
  goto LAB_00143575;
LAB_001435da:
  uVar14 = uVar14 + 1;
  goto LAB_00143599;
}

Assistant:

int NetOptimize::fuse_convolution_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution")
            continue;

        // Convolution - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Convolution - BinaryOp to Convolution
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolution->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolution_add %s %s\n", convolution->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolution->bias_term == 0)
            {
                // init bias
                convolution->bias_term = 1;
                convolution->bias_data = bias_data;
            }
            else
            {
                float* bias = convolution->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}